

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void PartialCRCBitByBitTest<unsigned_short,(unsigned_short)16>
               (char *data,size_t size,Parameters<unsigned_short,_(unsigned_short)16> *parameters,
               unsigned_short expectedCRC,string *crcName)

{
  char cVar1;
  char cVar2;
  unsigned_short reversedValue_2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  byte *pbVar6;
  unsigned_short reversedValue;
  uint uVar7;
  char *pcVar8;
  string *crcName_00;
  unsigned_short reversedValue_1;
  short sVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  bool in_stack_00000008;
  
  uVar5 = (uint)*(ushort *)data;
  uVar3 = (uint)*(ushort *)(data + 2);
  cVar1 = data[6];
  if (cVar1 == '\0') {
    pcVar8 = "123456789";
    lVar13 = 4;
    do {
      uVar3 = uVar3 ^ (uint)(byte)*pcVar8 << 8;
      lVar4 = 8;
      do {
        uVar3 = (int)(short)uVar3 >> 0xf & uVar5 ^ uVar3 * 2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      pcVar8 = (char *)((byte *)pcVar8 + 1);
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  else {
    sVar9 = 0x10;
    pcVar8 = (char *)0x0;
    uVar12 = uVar5;
    do {
      uVar7 = (uVar12 & 1) + (int)pcVar8 * 2;
      pcVar8 = (char *)(ulong)uVar7;
      uVar12 = uVar12 >> 1;
      sVar9 = sVar9 + -1;
    } while (sVar9 != 0);
    pcVar10 = "123456789";
    lVar13 = 4;
    do {
      uVar3 = uVar3 ^ (byte)*pcVar10;
      lVar4 = 8;
      do {
        uVar3 = (uVar3 & 0xffff) >> 1 ^ -(uVar3 & 1) & uVar7;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      pcVar10 = (char *)((byte *)pcVar10 + 1);
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  cVar2 = data[7];
  crcName_00 = (string *)CONCAT71((int7)((ulong)pcVar8 >> 8),cVar2);
  if (cVar1 != cVar2) {
    sVar9 = 0x10;
    uVar11 = 0;
    do {
      uVar11 = (ulong)((uVar3 & 1) + (int)uVar11 * 2);
      uVar3 = (uVar3 & 0xffff) >> 1;
      sVar9 = sVar9 + -1;
    } while (sVar9 != 0);
    sVar9 = 0x10;
    uVar3 = 0;
    do {
      uVar3 = ((uint)uVar11 & 1) + uVar3 * 2;
      uVar11 = (uVar11 & 0xffff) >> 1;
      sVar9 = sVar9 + -1;
    } while (sVar9 != 0);
  }
  if (cVar1 == '\0') {
    pbVar6 = (byte *)0x104008;
    lVar13 = 5;
    do {
      uVar3 = uVar3 ^ (uint)*pbVar6 << 8;
      lVar4 = 8;
      do {
        uVar3 = (int)(short)uVar3 >> 0xf & uVar5 ^ uVar3 * 2;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      pbVar6 = pbVar6 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  else {
    sVar9 = 0x10;
    uVar12 = 0;
    do {
      uVar12 = (uVar5 & 1) + uVar12 * 2;
      uVar5 = uVar5 >> 1;
      sVar9 = sVar9 + -1;
    } while (sVar9 != 0);
    pbVar6 = (byte *)0x104008;
    lVar13 = 5;
    do {
      uVar3 = uVar3 ^ *pbVar6;
      lVar4 = 8;
      do {
        uVar3 = (uVar3 & 0xffff) >> 1 ^ -(uVar3 & 1) & uVar12;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
      pbVar6 = pbVar6 + 1;
      lVar13 = lVar13 + -1;
    } while (lVar13 != 0);
  }
  uVar5 = uVar3;
  if (cVar1 != cVar2) {
    crcName_00 = (string *)CONCAT62((int6)((ulong)pcVar8 >> 0x10),0x10);
    uVar5 = 0;
    do {
      uVar5 = (uVar3 & 1) + uVar5 * 2;
      uVar3 = (uVar3 & 0xffff) >> 1;
      sVar9 = (short)crcName_00 + -1;
      crcName_00 = (string *)CONCAT62((int6)((ulong)crcName_00 >> 0x10),sVar9);
    } while (sVar9 != 0);
  }
  PrintResult<unsigned_short,(unsigned_short)16>
            (data,size & 0xffff,
             (Parameters<unsigned_short,_(unsigned_short)16> *)
             (ulong)((uVar5 ^ *(ushort *)(data + 4)) & 0xffff),(unsigned_short)parameters,
             *(ushort *)(data + 4),crcName_00,in_stack_00000008);
  return;
}

Assistant:

static void PartialCRCBitByBitTest(const char * data, size_t size, const CRC::Parameters<CRCType, CRCWidth> & parameters, CRCType expectedCRC, const std::string & crcName)
{
    CRCType computedCRC = CRC::Calculate(data, size / 2, parameters);

    // Don't forget (size + 1) to round odd numbers properly!
    computedCRC = CRC::Calculate(data + (size / 2), (size + 1) / 2, parameters, computedCRC);

    PrintResult<CRCType, CRCWidth>(data, size, parameters, expectedCRC, computedCRC, crcName, true);
}